

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase960::run(TestCase960 *this)

{
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Client cap;
  Client client;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetNullResults> promise;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_2a0;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call0;
  Maybe<capnp::MessageSize> local_1f8;
  Maybe<capnp::MessageSize> local_1e0;
  Maybe<capnp::MessageSize> local_1c8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  local_1b0 [3];
  Own<capnp::ResponseHook> local_180;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
  local_170 [3];
  Own<capnp::ResponseHook> local_140;
  TestContext context;
  
  TestContext::TestContext(&context);
  TestContext::connect((TestContext *)&promise,(int)&context,(sockaddr *)0x5,in_ECX);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>(&client,(Client *)&promise)
  ;
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&promise);
  local_1c8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getNullRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
              *)&call0,&client,&local_1c8);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
          *)&promise,(int)&call0,__buf,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  kj::Own<capnp::RequestHook>::dispose
            ((Own<capnp::RequestHook> *)&call0.super_Pipeline._typeless.ops.size_);
  capnproto_test::capnp::test::TestMoreStuff::GetNullResults::Pipeline::getNullCap
            (&cap,&promise.super_Pipeline);
  local_1e0.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)&call1,(Client *)(&cap.field_0x0 + *(long *)(cap._0_8_ + -0x20)),&local_1e0);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&call0,(int)&call1,__buf_00,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  kj::Own<capnp::RequestHook>::dispose
            ((Own<capnp::RequestHook> *)&call1.super_Pipeline._typeless.ops.size_);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>::wait
            (local_170,&promise);
  kj::Own<capnp::ResponseHook>::dispose(&local_140);
  local_1f8.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_2a0,(Client *)(&cap.field_0x0 + *(long *)(cap._0_8_ + -0x20)),&local_1f8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&call1,(int)&local_2a0,__buf_01,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  kj::Own<capnp::RequestHook>::dispose(&local_2a0.hook);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call0.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,&context.waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call1.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,&context.waitScope);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)&local_2a0,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait(local_1b0,&local_2a0);
  kj::Own<capnp::ResponseHook>::dispose(&local_180);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_2a0);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call1);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call0);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap.field_0x8);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>::~RemotePromise
            (&promise);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  TestContext::~TestContext(&context);
  return;
}

Assistant:

TEST(Rpc, EmbargoNull) {
  // Set up a situation where we pipeline on a capability that ends up coming back null. This
  // should NOT cause a Disembargo to be sent, but due to a bug in earlier versions of Cap'n Proto,
  // a Disembargo was indeed sent to the null capability, which caused the server to disconnect
  // due to protocol error.

  TestContext context;

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  auto promise = client.getNullRequest().send();

  auto cap = promise.getNullCap();

  auto call0 = cap.getCallSequenceRequest().send();

  promise.wait(context.waitScope);

  auto call1 = cap.getCallSequenceRequest().send();

  expectPromiseThrows(kj::mv(call0), context.waitScope);
  expectPromiseThrows(kj::mv(call1), context.waitScope);

  // Verify that we're still connected (there were no protocol errors).
  getCallSequence(client, 0).wait(context.waitScope);
}